

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * cfd::js::api::json::JsonMappingApi::VerifySign
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
  local_48;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = TransactionStructApi::VerifySign;
  local_18._8_8_ =
       std::
       _Function_handler<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&),_cfd::js::api::VerifySignResponseStruct_(*)(const_cfd::js::api::VerifySignRequestStruct_&)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&),_cfd::js::api::VerifySignResponseStruct_(*)(const_cfd::js::api::VerifySignRequestStruct_&)>
       ::_M_manager;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_function_pointer =
       ElementsTransactionStructApi::VerifySign;
  local_48._M_invoker =
       std::
       _Function_handler<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&),_cfd::js::api::VerifySignResponseStruct_(*)(const_cfd::js::api::VerifySignRequestStruct_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&),_cfd::js::api::VerifySignResponseStruct_(*)(const_cfd::js::api::VerifySignRequestStruct_&)>
       ::_M_manager;
  ExecuteElementsCheckApi<cfd::js::api::json::VerifySignRequest,cfd::js::api::json::VerifySignResponse,cfd::js::api::VerifySignRequestStruct,cfd::js::api::VerifySignResponseStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,&local_48,
             (function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
              *)std::
                _Function_handler<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&),_cfd::js::api::VerifySignResponseStruct_(*)(const_cfd::js::api::VerifySignRequestStruct_&)>
                ::_M_manager);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::VerifySign(const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::VerifySignRequest, api::json::VerifySignResponse,
      api::VerifySignRequestStruct, api::VerifySignResponseStruct>(
      request_message, TransactionStructApi::VerifySign,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::VerifySign);
#else
      TransactionStructApi::VerifySign);
#endif
}